

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

double cvui::internal::counter
                 (cvui_block_t *theBlock,int theX,int theY,double *theValue,double theStep,
                 char *theFormat)

{
  bool bVar1;
  allocator<char> local_71;
  double local_70;
  String local_68;
  Rect aContentArea;
  Size local_38;
  
  aContentArea.x = theX + 0x16;
  aContentArea.width = 0x30;
  aContentArea.height = 0x16;
  local_70 = theStep;
  aContentArea.y = theY;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"-",&local_71);
  bVar1 = button(theBlock,theX,theY,0x16,0x16,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    *theValue = *theValue - local_70;
  }
  sprintf(gBuffer,theFormat);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,gBuffer,&local_71);
  render::counter(theBlock,&aContentArea,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"+",&local_71);
  bVar1 = button(theBlock,theX + 0x46,theY,0x16,0x16,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    *theValue = local_70 + *theValue;
  }
  local_38.width = 0x5c;
  local_38.height = 0x16;
  updateLayoutFlow(theBlock,&local_38);
  return *theValue;
}

Assistant:

double counter(cvui_block_t& theBlock, int theX, int theY, double *theValue, double theStep, const char *theFormat) {
		cv::Rect aContentArea(theX + 22, theY, 48, 22);

		if (internal::button(theBlock, theX, theY, 22, 22, "-", false)) {
			*theValue -= theStep;
		}

		sprintf_s(internal::gBuffer, theFormat, *theValue);
		render::counter(theBlock, aContentArea, internal::gBuffer);

		if (internal::button(theBlock, aContentArea.x + aContentArea.width, theY, 22, 22, "+", false)) {
			*theValue += theStep;
		}

		// Update the layout flow
		cv::Size aSize(22 * 2 + aContentArea.width, aContentArea.height);
		updateLayoutFlow(theBlock, aSize);

		return *theValue;
	}